

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ParenPragmaExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParenPragmaExpressionSyntax,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,
          span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *args_1,Token *args_2)

{
  Token openParen;
  Token closeParen;
  ParenPragmaExpressionSyntax *this_00;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> local_58;
  
  this_00 = (ParenPragmaExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ParenPragmaExpressionSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ParenPragmaExpressionSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  openParen.kind = args->kind;
  openParen._2_1_ = args->field_0x2;
  openParen.numFlags.raw = (args->numFlags).raw;
  openParen.rawLen = args->rawLen;
  openParen.info = args->info;
  local_58.elements._M_ptr = args_1->_M_ptr;
  local_58.super_SyntaxListBase.childCount = (args_1->_M_extent)._M_extent_value;
  local_58.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_58.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_58.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_58.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005c7588;
  closeParen.kind = args_2->kind;
  closeParen._2_1_ = args_2->field_0x2;
  closeParen.numFlags.raw = (args_2->numFlags).raw;
  closeParen.rawLen = args_2->rawLen;
  closeParen.info = args_2->info;
  local_58.elements._M_extent._M_extent_value = local_58.super_SyntaxListBase.childCount;
  slang::syntax::ParenPragmaExpressionSyntax::ParenPragmaExpressionSyntax
            (this_00,openParen,&local_58,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }